

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.h
# Opt level: O3

void iDynTree::printVectorDifference<iDynTree::VectorFixSize<6u>,iDynTree::VectorFixSize<6u>>
               (string *name,VectorFixSize<6U> *vec1,VectorFixSize<6U> *vec2)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  uint i;
  long lVar4;
  double dVar5;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," : \n",4);
  lVar4 = 0;
  do {
    poVar3 = std::ostream::_M_insert<double>(vec1->m_data[lVar4] - vec2->m_data[lVar4]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ( ",3);
    dVar1 = vec1->m_data[lVar4];
    dVar2 = vec2->m_data[lVar4];
    dVar5 = dVar2;
    if (dVar2 <= dVar1) {
      dVar5 = dVar1;
    }
    poVar3 = std::ostream::_M_insert<double>((dVar1 - dVar2) / dVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ) ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return;
}

Assistant:

void printVectorDifference(std::string name, const VectorType1& vec1, const VectorType2& vec2)
    {
        std::cerr << name << " : \n";
        size_t minSize = vec1.size();

        if( vec2.size() < minSize )
        {
            minSize = vec2.size();
        }

        for(unsigned int i=0; i < minSize; i++ )
        {
            std::cerr << vec1(i) - vec2(i) << " ( " << (vec1(i) - vec2(i))/std::max(vec1(i),vec2(i)) << " ) " << "\n";
        }
    }